

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Help_View.cxx
# Opt level: O1

void __thiscall Fl_Help_View::end_selection(Fl_Help_View *this,int clipboard)

{
  EVP_PKEY_CTX *pEVar1;
  byte *pbVar2;
  byte bVar3;
  bool bVar4;
  bool bVar5;
  bool bVar6;
  EVP_PKEY_CTX EVar7;
  int iVar8;
  wchar_t wVar9;
  int iVar10;
  uint uVar11;
  size_t sVar12;
  EVP_PKEY_CTX *dst;
  char *pcVar13;
  byte *__s;
  EVP_PKEY_CTX *buf;
  byte *p;
  int iVar14;
  long lVar15;
  uint uVar16;
  uint uVar17;
  
  if ((selected == 0) || (current_view != this)) {
    return;
  }
  __s = (byte *)this->value_;
  sVar12 = strlen((char *)__s);
  dst = (EVP_PKEY_CTX *)malloc((long)((int)sVar12 + 1));
  bVar6 = false;
  uVar16 = 0;
  buf = dst;
  do {
    p = __s + 1;
    bVar3 = *__s;
    uVar17 = (uint)bVar3;
    bVar4 = true;
    if (bVar3 != 0) {
      lVar15 = 1;
      if (bVar3 == 0x26) {
        uVar17 = quote_char((char *)p);
        if ((int)uVar17 < 0) {
          uVar17 = 0x26;
        }
        else {
          lVar15 = 1;
          do {
            pbVar2 = __s + lVar15;
            lVar15 = lVar15 + 1;
            if (*pbVar2 == 0x3b) break;
          } while (*pbVar2 != 0);
        }
      }
      else if (bVar3 == 0x3c) {
        iVar14 = (int)__s + 1;
        do {
          bVar3 = *p;
          p = p + 1;
          if (bVar3 == 0) goto LAB_001b6feb;
          iVar14 = iVar14 + 1;
        } while (bVar3 != 0x3e);
        iVar8 = tolower((int)(char)__s[1]);
        bVar3 = __s[2];
        if ((0x3e < (ulong)bVar3) ||
           (uVar17 = iVar8 << 0x18, (0x4000000100000001U >> ((ulong)bVar3 & 0x3f) & 1) == 0)) {
          iVar10 = tolower((int)(char)bVar3);
          uVar17 = iVar8 << 0x18 | iVar10 << 0x10;
          bVar3 = __s[3];
          if ((0x3e < (ulong)bVar3) || ((0x4000000100000001U >> ((ulong)bVar3 & 0x3f) & 1) == 0)) {
            iVar8 = tolower((int)(char)bVar3);
            uVar11 = iVar8 << 8 | uVar17;
            bVar3 = __s[4];
            if ((0x3e < (ulong)bVar3) ||
               (uVar17 = uVar11, (0x4000000100000001U >> ((ulong)bVar3 & 0x3f) & 1) == 0)) {
              uVar17 = 0;
              if (((ulong)__s[5] < 0x3f) &&
                 (uVar17 = 0, (0x4000000100000001U >> ((ulong)__s[5] & 0x3f) & 1) != 0)) {
                uVar17 = tolower((int)(char)bVar3);
                uVar17 = uVar17 | uVar11;
              }
            }
          }
        }
        bVar5 = true;
        if ((int)uVar17 < 0x68310000) {
          if (0x2f6835ff < (int)uVar17) {
            if ((int)uVar17 < 0x62720000) {
              if (uVar17 == 0x2f683600) goto LAB_001b71bc;
              if (uVar17 == 0x2f700000) goto LAB_001b7184;
              if (uVar17 != 0x2f707265) goto LAB_001b723c;
              pcVar13 = (char *)0x0;
              bVar6 = false;
            }
            else if (uVar17 == 0x62720000) {
LAB_001b7184:
              bVar5 = false;
              pcVar13 = "\n";
            }
            else if (uVar17 == 0x64640000) {
              bVar5 = false;
              pcVar13 = "\n - ";
            }
            else {
              if (uVar17 != 0x64740000) goto LAB_001b723c;
              bVar5 = false;
              pcVar13 = "\n ";
            }
            goto LAB_001b71c5;
          }
          if ((int)uVar17 < 0x2f683300) {
            if ((uVar17 == 0x2f683100) || (uVar17 == 0x2f683200)) goto LAB_001b71bc;
          }
          else if ((uVar17 == 0x2f683300) || ((uVar17 == 0x2f683400 || (uVar17 == 0x2f683500)))) {
LAB_001b71bc:
            bVar5 = false;
            pcVar13 = "\n\n";
            goto LAB_001b71c5;
          }
LAB_001b723c:
          pcVar13 = (char *)0x0;
        }
        else {
          if ((int)uVar17 < 0x68360000) {
            if ((int)uVar17 < 0x68330000) {
              if ((uVar17 == 0x68310000) || (uVar17 == 0x68320000)) goto LAB_001b71bc;
            }
            else if ((uVar17 == 0x68330000) || ((uVar17 == 0x68340000 || (uVar17 == 0x68350000))))
            goto LAB_001b71bc;
            goto LAB_001b723c;
          }
          if ((int)uVar17 < 0x70726500) {
            if (uVar17 == 0x68360000) goto LAB_001b71bc;
            if (uVar17 != 0x6c690000) {
              if (uVar17 != 0x70000000) goto LAB_001b723c;
              goto LAB_001b7184;
            }
            bVar5 = false;
            pcVar13 = "\n * ";
          }
          else {
            if (uVar17 == 0x74720000) goto LAB_001b71bc;
            if (uVar17 == 0x74640000) goto LAB_001b7184;
            pcVar13 = (char *)0x0;
            if (uVar17 == 0x70726500) {
              bVar5 = true;
              pcVar13 = (char *)0x0;
              bVar6 = true;
            }
          }
        }
LAB_001b71c5:
        bVar4 = false;
        if (((!bVar5) && (iVar14 = iVar14 - *(int *)&this->value_, selection_first < iVar14)) &&
           (iVar14 <= selection_last)) {
          EVar7 = (EVP_PKEY_CTX)*pcVar13;
          while (EVar7 != (EVP_PKEY_CTX)0x0) {
            *buf = EVar7;
            buf = buf + 1;
            pEVar1 = (EVP_PKEY_CTX *)pcVar13 + 1;
            pcVar13 = (char *)((EVP_PKEY_CTX *)pcVar13 + 1);
            EVar7 = *pEVar1;
          }
          EVar7 = ((EVP_PKEY_CTX *)pcVar13)[-1];
          iVar14 = isspace((uint)(byte)EVar7);
          uVar16 = (uint)(byte)EVar7;
          if (iVar14 != 0) {
            uVar16 = 0x20;
          }
          bVar4 = false;
        }
        goto LAB_001b6feb;
      }
      iVar14 = (int)p - *(int *)&this->value_;
      if ((selection_first < iVar14) && (iVar14 <= selection_last)) {
        if ((!bVar6) && (((int)uVar17 < 0x100 && (iVar8 = isspace(uVar17), iVar8 != 0)))) {
          uVar17 = 0x20;
        }
        bVar4 = uVar16 != 0x20;
        uVar16 = uVar17;
        if (uVar17 != 0x20 || bVar4) {
          if (lVar15 == 1) {
            *buf = SUB41(uVar17,0);
            buf = buf + 1;
          }
          else {
            wVar9 = fl_utf8encode(uVar17,(char *)buf);
            buf = buf + wVar9;
          }
        }
      }
      bVar4 = selection_last < iVar14;
      p = __s + lVar15;
    }
LAB_001b6feb:
    __s = p;
    if (bVar4) {
      *buf = (EVP_PKEY_CTX)0x0;
      sVar12 = strlen((char *)dst);
      Fl::copy(dst,(EVP_PKEY_CTX *)(sVar12 & 0xffffffff));
      free(dst);
      return;
    }
  } while( true );
}

Assistant:

void Fl_Help_View::end_selection(int clipboard)
{
  if (!selected || current_view!=this)
    return;
  // convert the select part of our html text into some kind of somewhat readable UTF-8
  // and store it in the selection buffer
  int p = 0;
  char pre = 0;
  int len = (int) strlen(value_);
  char *txt = (char*)malloc(len+1), *d = txt;
  const char *s = value_, *cmd, *src;
  for (;;) {
    int c = (*s++) & 0xff;
    if (c==0) break;
    if (c=='<') { // begin of some html command. Skip until we find a '>'
      cmd = s;
      for (;;) {
        c = (*s++) & 0xff;
        if (c==0 || c=='>') break;
      }
      if (c==0) break;
      // do something with this command... .
      // The replacement string must not be longer than the command
      // itself plus '<' and '>'
      src = 0;
      switch (command(cmd)) {
        case CMD('p','r','e', 0 ): pre = 1; break;
        case CMD('/','p','r','e'): pre = 0; break;
        case CMD('t','d', 0 , 0 ):
        case CMD('p', 0 , 0 , 0 ):
        case CMD('/','p', 0 , 0 ):
        case CMD('b','r', 0 , 0 ): src = "\n"; break;
        case CMD('l','i', 0 , 0 ): src = "\n * "; break;
        case CMD('/','h','1', 0 ):
        case CMD('/','h','2', 0 ):
        case CMD('/','h','3', 0 ):
        case CMD('/','h','4', 0 ):
        case CMD('/','h','5', 0 ):
        case CMD('/','h','6', 0 ): src = "\n\n"; break;
        case CMD('t','r', 0 , 0 ):
        case CMD('h','1', 0 , 0 ):
        case CMD('h','2', 0 , 0 ):
        case CMD('h','3', 0 , 0 ):
        case CMD('h','4', 0 , 0 ):
        case CMD('h','5', 0 , 0 ):
        case CMD('h','6', 0 , 0 ): src = "\n\n"; break;
        case CMD('d','t', 0 , 0 ): src = "\n "; break;
        case CMD('d','d', 0 , 0 ): src = "\n - "; break;
      }
      int n = (int) (s-value_);
      if (src && n>selection_first && n<=selection_last) {
        while (*src) {
          *d++ = *src++;
        }
        c = src[-1] & 0xff;
        p = isspace(c) ? ' ' : c;
      }
      continue;
    }
    const char *s2 = s;
    if (c=='&') { // special characters (HTML entities)
      int xx = quote_char(s);
      if (xx >= 0) {
        c = xx;
        for (;;) {
          char cc = *s++;
          if (!cc || cc==';') break;
        }
      }
    }
    int n = (int) (s2-value_);
    if (n>selection_first && n<=selection_last) {
      if (!pre && c < 256 && isspace(c)) c = ' ';
      if (p != ' ' || c != ' ') {
        if (s2 != s) { // c was an HTML entity
          d += fl_utf8encode(c, d);
        }
        else *d++ = c;
      }
      p = c;
    }
    if (n>selection_last) break; // stop parsing html after end of selection
  }
  *d = 0;
  Fl::copy(txt, (int) strlen(txt), clipboard);
  // printf("copy [%s]\n", txt);
  free(txt);
}